

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos-op.c
# Opt level: O0

int dos_get_volume_label(hd_context *ctx,dos_disk *disk)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  int local_28;
  byte local_22;
  int i;
  uint8_t curpart;
  uint8_t ret;
  com_mbr *mbr;
  dos_disk *disk_local;
  hd_context *ctx_local;
  
  puVar1 = disk->first_sector;
  local_22 = 0;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    bVar3 = local_22;
    if ((puVar1[(long)local_28 * 0x10 + 0x1c2] == '\x05') ||
       (puVar1[(long)local_28 * 0x10 + 0x1c2] == '\x0f')) {
      bVar2 = parse_extend_partition
                        (ctx,disk,(com_parptition *)(puVar1 + (long)local_28 * 0x10 + 0x1be),
                         local_22,0);
      if (bVar2 != 0) {
        bVar3 = bVar2;
      }
    }
    else if (puVar1[(long)local_28 * 0x10 + 0x1c2] == 'B') {
      bVar3 = parse_extend_partition
                        (ctx,disk,(com_parptition *)(puVar1 + (long)local_28 * 0x10 + 0x1be),
                         local_22,0);
      if ((bVar3 == 0) &&
         (_Var4 = parse_master_partition
                            (ctx,disk,(com_parptition *)(puVar1 + (long)local_28 * 0x10 + 0x1be),
                             local_22,0), bVar3 = local_22, _Var4)) {
        bVar3 = local_22 + 1;
      }
    }
    else if (((puVar1[(long)local_28 * 0x10 + 0x1c2] != '\0') &&
             (*(short *)(puVar1 + 0x1fe) == -0x55ab)) &&
            (_Var4 = parse_master_partition
                               (ctx,disk,(com_parptition *)(puVar1 + (long)local_28 * 0x10 + 0x1be),
                                local_22,0), _Var4)) {
      bVar3 = local_22 + 1;
    }
    local_22 = bVar3;
  }
  return (int)local_22;
}

Assistant:

int dos_get_volume_label(hd_context *ctx, dos_disk *disk)
{
    com_mbr *mbr = (com_mbr *)disk->first_sector;

    uint8_t ret,curpart;
    curpart = 0;

    int i;
    for (i = 0; i < 4; i++)
    {
        ret = 0;
        if ( mbr->partition[i].pid == 0x05 || mbr->partition[i].pid == 0x0f )
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
        } else if (mbr->partition[i].pid == 0x42)
        {
            ret = parse_extend_partition(ctx, disk, &(mbr->partition[i]), curpart, 0);
            if (ret)
                curpart = ret;
            else
            {
                if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                    curpart++;
            }
        } else if (mbr->partition[i].pid != 0 && mbr->byEnding == 0xAA55)
        {
            if (parse_master_partition(ctx, disk, &(mbr->partition[i]), curpart, 0))
                curpart++;
        }
    }

    return curpart;
}